

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<char_*(unsigned_long)> * __thiscall
testing::internal::FunctionMocker<char_*(unsigned_long)>::With
          (FunctionMocker<char_*(unsigned_long)> *this,Matcher<unsigned_long> *m1)

{
  MockSpec<char_*(unsigned_long)> *pMVar1;
  FunctionMockerBase<char_*(unsigned_long)> *in_RDI;
  ArgumentMatcherTuple *in_stack_ffffffffffffffa8;
  
  FunctionMockerBase<char_*(unsigned_long)>::current_spec(in_RDI);
  std::tr1::make_tuple<testing::Matcher<unsigned_long>>(&in_stack_ffffffffffffffa8->f0_);
  MockSpec<char_*(unsigned_long)>::SetMatchers
            ((MockSpec<char_*(unsigned_long)> *)in_RDI,in_stack_ffffffffffffffa8);
  std::tr1::
  tuple<testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void,_void>::
  ~tuple((tuple<testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
          *)0x1bb6b1);
  pMVar1 = FunctionMockerBase<char_*(unsigned_long)>::current_spec(in_RDI);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }